

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

bool Test::run_tests(void)

{
  undefined8 *puVar1;
  bool bVar2;
  Registry *pRVar3;
  ostream *poVar4;
  Registry *pRVar5;
  bool bVar6;
  char *pcVar7;
  _List_node_base *p_Var8;
  
  bVar6 = true;
  pRVar3 = Registry::getInstance();
  pRVar5 = pRVar3;
  while (pRVar5 = (Registry *)
                  (pRVar5->tests).super__List_base<Test_*,_std::allocator<Test_*>_>._M_impl._M_node.
                  super__List_node_base._M_next, pRVar5 != pRVar3) {
    puVar1 = (undefined8 *)
             (pRVar5->tests).super__List_base<Test_*,_std::allocator<Test_*>_>._M_impl._M_node.
             _M_size;
    poVar4 = std::operator<<((ostream *)&std::cout,"Testing: ");
    poVar4 = std::operator<<(poVar4,(char *)*puVar1);
    std::operator<<(poVar4,"... ");
    std::ostream::flush();
    bVar2 = std::function<bool_()>::operator()((function<bool_()> *)(puVar1 + 1));
    pcVar7 = "Ok.";
    if (!bVar2) {
      pcVar7 = "FAILED!";
    }
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar6 = (bool)(bVar6 & bVar2);
  }
  pRVar5 = Registry::getInstance();
  if ((pRVar5->marks).
      super__List_base<std::pair<const_char_*,_int>,_std::allocator<std::pair<const_char_*,_int>_>_>
      ._M_impl._M_node._M_size != 0) {
    poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar4 = std::operator<<(poVar4,"Marked lines:");
    std::endl<char,std::char_traits<char>>(poVar4);
    pRVar5 = Registry::getInstance();
    p_Var8 = (_List_node_base *)&pRVar5->marks;
    while (p_Var8 = (((_List_base<std::pair<const_char_*,_int>,_std::allocator<std::pair<const_char_*,_int>_>_>
                       *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var8 != (_List_node_base *)&pRVar5->marks) {
      poVar4 = std::operator<<((ostream *)&std::cout,(char *)p_Var8[1]._M_next);
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*(int *)&p_Var8[1]._M_prev);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  return bVar6;
}

Assistant:

bool Test::run_tests()
{
	using namespace std;

	bool success = true;
	for (Test *test : Registry::getInstance().tests)
	{
		cout << "Testing: " << test->description << "... " << flush;
		bool ret = false;
		try
		{
			ret = test->body();
			cout << (ret ? "Ok." : "FAILED!") << endl;
		}
		catch (std::exception &e)
			{ cout << "FAILED!" << endl << '\t' << e.what() << endl; }
		catch (...)
			{ cout << "FAILED!\n\tAn undetermined exception occurred!" << endl; }
		success &= ret;
	}

	if (Registry::getInstance().marks.size() > 0)
	{
		cout << endl << "Marked lines:" << endl;
		for (Registry::Mark &mark : Registry::getInstance().marks)
			cout << mark.first << ':' << mark.second << endl;
	}

	return success;
}